

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_net_methods.cpp
# Opt level: O1

void Marshall_list_proc(int the_socket,Am_Value *in_value,Am_Connection *my_connection_ptr)

{
  bool bVar1;
  Am_Value *initial;
  Am_Value_List in_list;
  Am_Value_List AStack_48;
  Am_Value local_38;
  Am_Value local_28;
  
  Am_Value_List::Am_Value_List(&AStack_48,in_value);
  local_38.value._0_2_ = Am_Value_List::Length(&AStack_48);
  local_38.type = 2;
  local_38.value.long_value._2_6_ = 0;
  Am_Connection::Send(my_connection_ptr,&local_38);
  Am_Value::~Am_Value(&local_38);
  Am_Value_List::Start(&AStack_48);
  while( true ) {
    bVar1 = Am_Value_List::Last(&AStack_48);
    if (bVar1) break;
    initial = Am_Value_List::Get(&AStack_48);
    Am_Value::Am_Value(&local_28,initial);
    Am_Connection::Send(my_connection_ptr,&local_28);
    Am_Value::~Am_Value(&local_28);
    Am_Value_List::Next(&AStack_48);
  }
  Am_Value_List::~Am_Value_List(&AStack_48);
  return;
}

Assistant:

Am_Define_Method(Am_Marshall_Method, void, Marshall_list,
                 (int the_socket, const Am_Value &in_value,
                  Am_Connection *my_connection_ptr))
{
  (void)the_socket; // avoid warning
  Am_Value_List in_list = in_value;
  my_connection_ptr->Send(in_list.Length());
  for (in_list.Start(); !in_list.Last(); in_list.Next())
    my_connection_ptr->Send(in_list.Get());
}